

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall
notch::io::PlainTextNetworkReader::read_weights
          (PlainTextNetworkReader *this,istream *in,Array *w,Array *bias)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  float *pfVar5;
  ulong local_48;
  size_t col;
  size_t row;
  size_t nOutputs;
  size_t nInputs;
  Array *bias_local;
  Array *w_local;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  
  sVar1 = core::std::valarray<float>::size(w);
  sVar2 = core::std::valarray<float>::size(bias);
  sVar3 = core::std::valarray<float>::size(bias);
  for (col = 0; col < sVar3; col = col + 1) {
    pvVar4 = (void *)std::istream::operator>>(in,std::ws<char,std::char_traits<char>>);
    pfVar5 = core::std::valarray<float>::operator[](bias,col);
    std::istream::operator>>(pvVar4,pfVar5);
    for (local_48 = 0; local_48 < sVar1 / sVar2; local_48 = local_48 + 1) {
      pvVar4 = (void *)std::istream::operator>>(in,std::ws<char,std::char_traits<char>>);
      pfVar5 = core::std::valarray<float>::operator[](w,col * (sVar1 / sVar2) + local_48);
      std::istream::operator>>(pvVar4,pfVar5);
    }
  }
  return;
}

Assistant:

void read_weights(std::istream &in, Array &w, Array &bias) {
        size_t nInputs = w.size() / bias.size();
        size_t nOutputs = bias.size();
        for (size_t row = 0; row < nOutputs; ++row) {
            in >> std::ws >> bias[row];
            for (size_t col = 0; col < nInputs; ++col) {
                in >> std::ws >> w[row*nInputs + col];
            }
        }
    }